

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

void __thiscall
booster::locale::basic_message<wchar_t>::basic_message
          (basic_message<wchar_t> *this,string_type *context,string_type *id)

{
  this->n_ = 0;
  this->c_id_ = (char_type_conflict *)0x0;
  this->c_context_ = (char_type_conflict *)0x0;
  this->c_plural_ = (char_type_conflict *)0x0;
  std::__cxx11::wstring::wstring((wstring *)&this->id_,(wstring *)id);
  std::__cxx11::wstring::wstring((wstring *)&this->context_,(wstring *)context);
  (this->plural_)._M_dataplus._M_p = (pointer)&(this->plural_).field_2;
  (this->plural_)._M_string_length = 0;
  (this->plural_).field_2._M_local_buf[0] = L'\0';
  return;
}

Assistant:

explicit basic_message(string_type const &context,string_type const &id) :
                n_(0),
                c_id_(0),
                c_context_(0),
                c_plural_(0),
                id_(id),
                context_(context)
            {
            }